

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t b_find_last_key(ion_bpp_handle_t handle,void *key,ion_bpp_external_address_t *rec)

{
  ushort uVar1;
  int iVar2;
  ion_bpp_node_t *piVar3;
  ion_bpp_buffer_t *piVar4;
  ion_bpp_err_t iVar5;
  ion_bpp_buffer_t *buf;
  
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  do {
    piVar4 = buf;
    piVar3 = buf->p;
    uVar1 = *(ushort *)piVar3;
    if ((uVar1 & 1) != 0) {
      if (uVar1 < 2) {
        return bErrKeyNotFound;
      }
      memcpy(key,&piVar3->fkey + (long)*(int *)((long)handle + 0xbc) * ((ulong)(uVar1 >> 1) - 1),
             (long)*(int *)((long)handle + 8));
      piVar3 = piVar4->p;
      iVar2 = *(int *)((long)handle + 0xbc);
      *rec = *(ion_bpp_external_address_t *)
              (&piVar3->fkey +
              (long)*(int *)((long)handle + 8) + (long)(int)(((*(ushort *)piVar3 >> 1) - 1) * iVar2)
              );
      *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar4;
      *(ion_bpp_key_t **)((long)handle + 0xb0) =
           &piVar3->fkey + (int)(((*(ushort *)piVar3 >> 1) - 1) * iVar2);
      return bErrOk;
    }
    iVar5 = readDisk(handle,*(ion_bpp_address_t *)
                             ((long)&piVar3[1].field_0x0 +
                             (long)*(int *)((long)handle + 0xbc) * ((ulong)(uVar1 >> 1) - 1) +
                             (long)*(int *)((long)handle + 8)),&buf);
  } while (iVar5 == bErrOk);
  return iVar5;
}

Assistant:

ion_bpp_err_t
b_find_last_key(
	ion_bpp_handle_t			handle,
	void						*key,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	while (!leaf(buf)) {
		if ((rc = readDisk(handle, childGE(lkey(buf)), &buf)) != 0) {
			return rc;
		}
	}

	if (ct(buf) == 0) {
		return bErrKeyNotFound;
	}

	memcpy(key, key(lkey(buf)), h->keySize);
	*rec		= rec(lkey(buf));
	h->curBuf	= buf;
	h->curKey	= lkey(buf);
	return bErrOk;
}